

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamCoreRandom.hpp
# Opt level: O2

void TasDREAM::genGaussianSamples
               (vector<double,_std::allocator<double>_> *means,
               vector<double,_std::allocator<double>_> *deviations,int num_samples,
               vector<double,_std::allocator<double>_> *x,function<double_()> *get_random01)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  size_type __new_size;
  double *pdVar7;
  runtime_error *this;
  long lVar8;
  size_type sVar9;
  pointer pdVar10;
  double *pdVar11;
  const_iterator im;
  double *pdVar12;
  function<double_()> local_48;
  
  lVar8 = (long)(means->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(means->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar8 != (long)(deviations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(deviations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,
               "ERROR: genGaussianSamples() means and deviations vectors must have the same size.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pdVar10 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  sVar9 = (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
  __new_size = (long)num_samples * (lVar8 >> 3);
  if (sVar9 != __new_size) {
    std::vector<double,_std::allocator<double>_>::resize(x,__new_size);
    pdVar10 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    sVar9 = (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
  }
  std::__fill_n_a<double*,unsigned_long,double>(pdVar10,sVar9);
  std::function<double_()>::function(&local_48,get_random01);
  applyGaussianUpdate(x,1.0,&local_48);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  pdVar7 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar4 = (means->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (deviations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (deviations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  while (pdVar11 = pdVar5, pdVar12 = pdVar4, pdVar7 != pdVar3) {
    for (; pdVar11 != pdVar6; pdVar11 = pdVar11 + 1) {
      dVar1 = *pdVar11;
      dVar2 = *pdVar7;
      *pdVar7 = dVar1 * dVar2;
      *pdVar7 = dVar1 * dVar2 + *pdVar12;
      pdVar7 = pdVar7 + 1;
      pdVar12 = pdVar12 + 1;
    }
  }
  return;
}

Assistant:

inline void genGaussianSamples(const std::vector<double> &means, const std::vector<double> &deviations,
                               int num_samples, std::vector<double> &x, std::function<double(void)> get_random01 = tsgCoreUniform01){
    if (means.size() != deviations.size()) throw std::runtime_error("ERROR: genGaussianSamples() means and deviations vectors must have the same size.");
    if (x.size() != means.size() * num_samples) x.resize(means.size() * num_samples);

    std::fill_n(x.data(), x.size(), 0.0);
    applyGaussianUpdate(x, 1.0, get_random01);

    auto ix = x.begin();
    while(ix != x.end()){
        auto im = means.begin();
        for(auto s : deviations){
            *ix *= s;
            *ix++ += *im++;
        }
    }
}